

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DeadBranchElimPass::FixPhiNodesInLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  BasicBlock *block;
  value_type *__x;
  pointer pOVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  IRContext *pIVar4;
  DefUseManager *this_00;
  uint **ppuVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  uint32_t uVar9;
  spv_operand_type_t id;
  size_type sVar10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  Instruction *pIVar13;
  Operand *pOVar14;
  size_type sVar15;
  uint **ppuVar16;
  Instruction *this_01;
  undefined8 extraout_RAX;
  uint uVar17;
  ulong uVar18;
  __node_base_ptr p_Var19;
  uint32_t uVar20;
  bool bVar21;
  BasicBlock *inc;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  spv_operand_type_t local_9c;
  MemPass *local_98;
  BasicBlock *local_90;
  initializer_list<unsigned_int> local_88;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_78;
  undefined8 local_60;
  uint32_t local_54;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  pointer local_48;
  pointer local_40;
  Instruction *local_38;
  
  local_40 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_40 == local_48) {
    bVar8 = 0;
  }
  else {
    local_60 = 0;
    local_98 = &this->super_MemPass;
    local_50 = &live_blocks->_M_h;
    do {
      block = (local_40->_M_t).
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)block;
      sVar10 = std::
               _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(local_50,(key_type *)&local_78);
      if (sVar10 != 0) {
        this_01 = *(Instruction **)
                   ((long)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        local_38 = (Instruction *)
                   ((long)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
        if (this_01 != local_38) {
          do {
            if (this_01->opcode_ != OpPhi) break;
            local_78.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __x = (this_01->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            if ((this_01->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_finish == __x) {
LAB_00555f91:
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      (&local_78,__x);
            pOVar1 = (this_01->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(this_01->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
                       -0x5555555555555555) < 2) goto LAB_00555f91;
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      (&local_78,pOVar1 + 1);
            uVar17 = (this_01->has_result_id_ & 1) + 1;
            if (this_01->has_type_id_ == false) {
              uVar17 = (uint)this_01->has_result_id_;
            }
            if ((int)((ulong)((long)(this_01->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar17 < 2) {
              bVar7 = false;
              bVar21 = false;
            }
            else {
              uVar20 = 1;
              bVar21 = false;
              bVar7 = false;
              do {
                uVar9 = Instruction::GetSingleWordOperand(this_01,uVar17 + uVar20);
                local_90 = GetParentBlock((DeadBranchElimPass *)local_98,uVar9);
                uVar2 = (unreachable_continues->_M_h)._M_bucket_count;
                uVar18 = (ulong)local_90 % uVar2;
                p_Var3 = (unreachable_continues->_M_h)._M_buckets[uVar18];
                p_Var11 = (__node_base_ptr)0x0;
                if ((p_Var3 != (__node_base_ptr)0x0) &&
                   (p_Var11 = p_Var3, p_Var19 = p_Var3->_M_nxt,
                   local_90 != (BasicBlock *)p_Var3->_M_nxt[1]._M_nxt)) {
                  while (p_Var12 = p_Var19->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
                    p_Var11 = (__node_base_ptr)0x0;
                    if (((ulong)p_Var12[1]._M_nxt % uVar2 != uVar18) ||
                       (p_Var11 = p_Var19, p_Var19 = p_Var12,
                       local_90 == (BasicBlock *)p_Var12[1]._M_nxt)) goto LAB_00555b6a;
                  }
                  p_Var11 = (__node_base_ptr)0x0;
                }
LAB_00555b6a:
                if (p_Var11 == (__node_base_ptr)0x0) {
                  p_Var12 = (_Hash_node_base *)0x0;
                }
                else {
                  p_Var12 = p_Var11->_M_nxt;
                }
                if ((p_Var12 == (_Hash_node_base *)0x0) ||
                   ((BasicBlock *)p_Var12[2]._M_nxt != block)) {
LAB_00555c30:
                  sVar10 = std::
                           _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count(local_50,&local_90);
                  if ((sVar10 != 0) && (bVar6 = BasicBlock::IsSuccessor(local_90,block), bVar6)) {
                    pOVar14 = Instruction::GetInOperand(this_01,uVar20 - 1);
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    push_back(&local_78,pOVar14);
                    goto LAB_00555c70;
                  }
                  bVar21 = true;
                }
                else {
                  uVar17 = (this_01->has_result_id_ & 1) + 1;
                  if (this_01->has_type_id_ == false) {
                    uVar17 = (uint)this_01->has_result_id_;
                  }
                  if ((int)((ulong)((long)(this_01->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_01->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar17 < 5) goto LAB_00555c30;
                  pIVar4 = (((MemPass *)&local_98->super_Pass)->super_Pass).context_;
                  if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                    IRContext::BuildDefUseManager(pIVar4);
                  }
                  this_00 = (pIVar4->def_use_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                            _M_head_impl;
                  uVar17 = (this_01->has_result_id_ & 1) + 1;
                  if (this_01->has_type_id_ == false) {
                    uVar17 = (uint)this_01->has_result_id_;
                  }
                  uVar9 = Instruction::GetSingleWordOperand(this_01,(uVar17 + uVar20) - 1);
                  pIVar13 = analysis::DefUseManager::GetDef(this_00,uVar9);
                  if (pIVar13->opcode_ == OpUndef) {
                    pOVar14 = Instruction::GetInOperand(this_01,uVar20 - 1);
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    push_back(&local_78,pOVar14);
                    bVar7 = true;
                  }
                  else {
                    local_9c = SPV_OPERAND_TYPE_ID;
                    uVar9 = 0;
                    if (this_01->has_type_id_ == true) {
                      uVar9 = Instruction::GetSingleWordOperand(this_01,0);
                    }
                    local_54 = MemPass::Type2Undef(local_98,uVar9);
                    local_88._M_array = &stack0xffffffffffffffac;
                    local_88._M_len = 1;
                    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
                    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>
                                *)&local_78,&local_9c,&local_88);
                    bVar7 = true;
                    bVar21 = true;
                  }
LAB_00555c70:
                  pOVar14 = Instruction::GetInOperand(this_01,uVar20);
                  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                  push_back(&local_78,pOVar14);
                }
                uVar20 = uVar20 + 2;
                uVar17 = (this_01->has_result_id_ & 1) + 1;
                if (this_01->has_type_id_ == false) {
                  uVar17 = (uint)this_01->has_result_id_;
                }
              } while (uVar20 < (int)((ulong)((long)(this_01->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this_01->operands_).
                                                                                                      
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                -0x55555555 - uVar17);
            }
            if (bVar21) {
              id = BasicBlock::ContinueBlockIdIfAny(block);
              if (id != SPV_OPERAND_TYPE_NONE && !bVar7) {
                local_88._M_array = (iterator)GetParentBlock((DeadBranchElimPass *)local_98,id);
                sVar15 = std::
                         _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::count(&unreachable_continues->_M_h,(key_type *)&local_88);
                if ((sVar15 != 0) &&
                   (4 < (ulong)(((long)local_78.
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_78.
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555))) {
                  local_90._0_4_ = 1;
                  uVar20 = 0;
                  if (this_01->has_type_id_ == true) {
                    uVar20 = Instruction::GetSingleWordOperand(this_01,0);
                  }
                  local_9c = MemPass::Type2Undef(local_98,uVar20);
                  local_88._M_array = &local_9c;
                  local_88._M_len = 1;
                  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
                  emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>
                              *)&local_78,(spv_operand_type_t *)&local_90,&local_88);
                  local_90 = (BasicBlock *)CONCAT44(local_90._4_4_,1);
                  local_88._M_array = &local_9c;
                  local_88._M_len = 1;
                  local_9c = id;
                  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
                  emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>
                              *)&local_78,(spv_operand_type_t *)&local_90,&local_88);
                }
              }
              if ((long)local_78.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0xc0) {
                ppuVar5 = (uint **)local_78.
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2].words.large_data_.
                                   _M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl;
                ppuVar16 = &local_78.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start[2].words.small_data_;
                if (ppuVar5 != (uint **)0x0) {
                  ppuVar16 = ppuVar5;
                }
                uVar20 = **ppuVar16;
                pIVar4 = (((MemPass *)&local_98->super_Pass)->super_Pass).context_;
                uVar9 = 0;
                if (this_01->has_result_id_ == true) {
                  uVar9 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
                }
                IRContext::KillNamesAndDecorates(pIVar4,uVar9);
                pIVar4 = (((MemPass *)&local_98->super_Pass)->super_Pass).context_;
                uVar9 = 0;
                if (this_01->has_result_id_ == true) {
                  uVar9 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
                }
                IRContext::ReplaceAllUsesWith(pIVar4,uVar9,uVar20);
                this_01 = IRContext::KillInst((((MemPass *)&local_98->super_Pass)->super_Pass).
                                              context_,this_01);
                local_60._1_7_ = (undefined7)((ulong)this_01 >> 8);
                local_60._0_1_ = 1;
              }
              else {
                pIVar4 = (((MemPass *)&local_98->super_Pass)->super_Pass).context_;
                if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar4);
                }
                analysis::DefUseManager::EraseUseRecordsOfOperandIds
                          ((pIVar4->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,this_01);
                Instruction::ReplaceOperands(this_01,(OperandList *)&local_78);
                pIVar4 = (((MemPass *)&local_98->super_Pass)->super_Pass).context_;
                if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar4);
                }
                analysis::DefUseManager::AnalyzeInstUse
                          ((pIVar4->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,this_01);
                this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
                local_60._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
                local_60._0_1_ = 1;
              }
            }
            else {
              this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      (&local_78);
          } while (this_01 != local_38);
        }
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
    bVar8 = (byte)local_60;
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool DeadBranchElimPass::FixPhiNodesInLiveBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto& block : *func) {
    if (live_blocks.count(&block)) {
      for (auto iter = block.begin(); iter != block.end();) {
        if (iter->opcode() != spv::Op::OpPhi) {
          break;
        }

        bool changed = false;
        bool backedge_added = false;
        Instruction* inst = &*iter;
        std::vector<Operand> operands;
        // Build a complete set of operands (not just input operands). Start
        // with type and result id operands.
        operands.push_back(inst->GetOperand(0u));
        operands.push_back(inst->GetOperand(1u));
        // Iterate through the incoming labels and determine which to keep
        // and/or modify.  If there in an unreachable continue block, there will
        // be an edge from that block to the header.  We need to keep it to
        // maintain the structured control flow.  If the header has more that 2
        // incoming edges, then the OpPhi must have an entry for that edge.
        // However, if there is only one other incoming edge, the OpPhi can be
        // eliminated.
        for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
          BasicBlock* inc = GetParentBlock(inst->GetSingleWordInOperand(i));
          auto cont_iter = unreachable_continues.find(inc);
          if (cont_iter != unreachable_continues.end() &&
              cont_iter->second == &block && inst->NumInOperands() > 4) {
            if (get_def_use_mgr()
                    ->GetDef(inst->GetSingleWordInOperand(i - 1))
                    ->opcode() == spv::Op::OpUndef) {
              // Already undef incoming value, no change necessary.
              operands.push_back(inst->GetInOperand(i - 1));
              operands.push_back(inst->GetInOperand(i));
              backedge_added = true;
            } else {
              // Replace incoming value with undef if this phi exists in the
              // loop header. Otherwise, this edge is not live since the
              // unreachable continue block will be replaced with an
              // unconditional branch to the header only.
              operands.emplace_back(
                  SPV_OPERAND_TYPE_ID,
                  std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
              operands.push_back(inst->GetInOperand(i));
              changed = true;
              backedge_added = true;
            }
          } else if (live_blocks.count(inc) && inc->IsSuccessor(&block)) {
            // Keep live incoming edge.
            operands.push_back(inst->GetInOperand(i - 1));
            operands.push_back(inst->GetInOperand(i));
          } else {
            // Remove incoming edge.
            changed = true;
          }
        }

        if (changed) {
          modified = true;
          uint32_t continue_id = block.ContinueBlockIdIfAny();
          if (!backedge_added && continue_id != 0 &&
              unreachable_continues.count(GetParentBlock(continue_id)) &&
              operands.size() > 4) {
            // Changed the backedge to branch from the continue block instead
            // of a successor of the continue block. Add an entry to the phi to
            // provide an undef for the continue block. Since the successor of
            // the continue must also be unreachable (dominated by the continue
            // block), any entry for the original backedge has been removed
            // from the phi operands.
            operands.emplace_back(
                SPV_OPERAND_TYPE_ID,
                std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
            operands.emplace_back(SPV_OPERAND_TYPE_ID,
                                  std::initializer_list<uint32_t>{continue_id});
          }

          // Either replace the phi with a single value or rebuild the phi out
          // of |operands|.
          //
          // We always have type and result id operands. So this phi has a
          // single source if there are two more operands beyond those.
          if (operands.size() == 4) {
            // First input data operands is at index 2.
            uint32_t replId = operands[2u].words[0];
            context()->KillNamesAndDecorates(inst->result_id());
            context()->ReplaceAllUsesWith(inst->result_id(), replId);
            iter = context()->KillInst(&*inst);
          } else {
            // We've rewritten the operands, so first instruct the def/use
            // manager to forget uses in the phi before we replace them. After
            // replacing operands update the def/use manager by re-analyzing
            // the used ids in this phi.
            get_def_use_mgr()->EraseUseRecordsOfOperandIds(inst);
            inst->ReplaceOperands(operands);
            get_def_use_mgr()->AnalyzeInstUse(inst);
            ++iter;
          }
        } else {
          ++iter;
        }
      }
    }
  }

  return modified;
}